

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_test.cpp
# Opt level: O1

void __thiscall
metacall_test_DefaultConstructor_Test::TestBody(metacall_test_DefaultConstructor_Test *this)

{
  undefined8 *puVar1;
  internal iVar2;
  undefined4 uVar3;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 uVar5;
  AssertHelperData *__s;
  size_t sVar6;
  char *pcVar7;
  size_t size;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar;
  metacall_log_stdio_type log_stdio;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  Message local_68;
  undefined8 *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  code *local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  undefined8 local_28;
  
  metacall_print_info();
  local_28 = _stdout;
  local_68.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )((ulong)local_68.ss_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_ << 0x20);
  local_70._M_head_impl._0_4_ = metacall_log(0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_58,"(int)0",
             "(int)metacall_log(METACALL_LOG_STDIO, (void *)&log_stdio)",(int *)&local_68,
             (int *)&local_70);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_68);
    if ((undefined8 *)CONCAT44(uStack_4c,uStack_50) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT44(uStack_4c,uStack_50);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
               ,0x44,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,&local_68);
  }
  else {
    puVar1 = (undefined8 *)CONCAT44(uStack_4c,uStack_50);
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    local_68.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )((ulong)local_68.ss_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl & 0xffffffff00000000);
    uVar3 = metacall_initialize();
    local_70._M_head_impl._0_4_ = uVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_58,"(int)0","(int)metacall_initialize()",(int *)&local_68,
               (int *)&local_70);
    if (local_58._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_68);
      if ((undefined8 *)CONCAT44(uStack_4c,uStack_50) == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)CONCAT44(uStack_4c,uStack_50);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                 ,0x46,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,&local_68);
    }
    else {
      puVar1 = (undefined8 *)CONCAT44(uStack_4c,uStack_50);
      if (puVar1 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar1 != puVar1 + 2) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      local_68.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )((ulong)local_68.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl & 0xffffffff00000000);
      uVar3 = metacall_register("c_print",c_function,0,3,1,7);
      local_70._M_head_impl._0_4_ = uVar3;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_58,"(int)0",
                 "(int)metacall_register(\"c_print\", c_function, __null, METACALL_INT, 1, METACALL_STRING)"
                 ,(int *)&local_68,(int *)&local_70);
      iVar2 = local_58._0_1_;
      if (local_58._0_1_ != (internal)0x0) {
        puVar1 = (undefined8 *)CONCAT44(uStack_4c,uStack_50);
        if (puVar1 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar1 != puVar1 + 2) {
            operator_delete((undefined8 *)*puVar1);
          }
          operator_delete(puVar1);
        }
        pbVar4 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 metacall("c_print","Hello native function!");
        local_68.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )0x0;
        local_70._M_head_impl = pbVar4;
        testing::internal::CmpHelperNE<void*,void*>
                  ((internal *)&local_58,"(void *)__null","(void *)ret",(void **)&local_68,
                   &local_70._M_head_impl);
        if (local_58._0_1_ == (internal)0x0) {
          testing::Message::Message(&local_68);
          if ((undefined8 *)CONCAT44(uStack_4c,uStack_50) == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)CONCAT44(uStack_4c,uStack_50);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x6f,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,&local_68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
          if (local_68.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_68.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
        }
        puVar1 = (undefined8 *)CONCAT44(uStack_4c,uStack_50);
        if (puVar1 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar1 != puVar1 + 2) {
            operator_delete((undefined8 *)*puVar1);
          }
          operator_delete(puVar1);
        }
        uVar3 = metacall_value_to_int(pbVar4);
        local_68.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = uVar3;
        local_70._M_head_impl._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_58,"(int)result","(int)1",(int *)&local_68,(int *)&local_70);
        if (local_58._0_1_ == (internal)0x0) {
          testing::Message::Message(&local_68);
          if ((undefined8 *)CONCAT44(uStack_4c,uStack_50) == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)CONCAT44(uStack_4c,uStack_50);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x73,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,&local_68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
          if (local_68.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_68.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
        }
        puVar1 = (undefined8 *)CONCAT44(uStack_4c,uStack_50);
        if (puVar1 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar1 != puVar1 + 2) {
            operator_delete((undefined8 *)*puVar1);
          }
          operator_delete(puVar1);
        }
        metacall_value_destroy(pbVar4);
        pbVar4 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 metacall_function("c_print");
        local_68.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )0x0;
        local_70._M_head_impl = pbVar4;
        testing::internal::CmpHelperNE<void*,void*>
                  ((internal *)&local_58,"(void *)__null","(void *)func",(void **)&local_68,
                   &local_70._M_head_impl);
        if (local_58._0_1_ == (internal)0x0) {
          testing::Message::Message(&local_68);
          if ((undefined8 *)CONCAT44(uStack_4c,uStack_50) == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)CONCAT44(uStack_4c,uStack_50);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x79,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,&local_68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
          if (local_68.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_68.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
        }
        puVar1 = (undefined8 *)CONCAT44(uStack_4c,uStack_50);
        if (puVar1 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar1 != puVar1 + 2) {
            operator_delete((undefined8 *)*puVar1);
          }
          operator_delete(puVar1);
        }
        pbVar4 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 metacallf(pbVar4,"Hello native function!");
        local_68.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )0x0;
        local_70._M_head_impl = pbVar4;
        testing::internal::CmpHelperNE<void*,void*>
                  ((internal *)&local_58,"(void *)__null","(void *)ret",(void **)&local_68,
                   &local_70._M_head_impl);
        if (local_58._0_1_ == (internal)0x0) {
          testing::Message::Message(&local_68);
          if ((undefined8 *)CONCAT44(uStack_4c,uStack_50) == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)CONCAT44(uStack_4c,uStack_50);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x7d,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,&local_68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
          if (local_68.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_68.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
        }
        puVar1 = (undefined8 *)CONCAT44(uStack_4c,uStack_50);
        if (puVar1 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar1 != puVar1 + 2) {
            operator_delete((undefined8 *)*puVar1);
          }
          operator_delete(puVar1);
        }
        uVar3 = metacall_value_to_int(pbVar4);
        local_68.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = uVar3;
        local_70._M_head_impl._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_58,"(int)result","(int)1",(int *)&local_68,(int *)&local_70);
        if (local_58._0_1_ == (internal)0x0) {
          testing::Message::Message(&local_68);
          if ((undefined8 *)CONCAT44(uStack_4c,uStack_50) == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)CONCAT44(uStack_4c,uStack_50);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x81,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,&local_68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
          if (local_68.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)local_68.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
        }
        puVar1 = (undefined8 *)CONCAT44(uStack_4c,uStack_50);
        if (puVar1 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar1 != puVar1 + 2) {
            operator_delete((undefined8 *)*puVar1);
          }
          operator_delete(puVar1);
        }
        metacall_value_destroy(pbVar4);
        if (iVar2 == (internal)0x0) {
          return;
        }
        local_70._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_48 = free;
        local_58 = 0x14e408;
        uStack_54 = 0;
        uStack_50 = 0x14e530;
        uStack_4c = 0;
        uVar5 = metacall_allocator_create(0);
        __s = (AssertHelperData *)metacall_inspect(&local_70,uVar5);
        local_38._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_30.data_ = __s;
        testing::internal::CmpHelperNE<char*,char*>
                  ((internal *)&local_68,"(char *)__null","(char *)inspect_str",(char **)&local_38,
                   (char **)&local_30);
        if (local_68.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_38);
          if (local_60 == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = (char *)*local_60;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x255,pcVar7);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if (local_38._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_38._M_head_impl + 8))();
          }
        }
        puVar1 = local_60;
        if (local_60 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_60 != local_60 + 2) {
            operator_delete((undefined8 *)*local_60);
          }
          operator_delete(puVar1);
        }
        local_38._M_head_impl = local_70._M_head_impl;
        local_30.data_ = (AssertHelperData *)0x0;
        testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                  ((internal *)&local_68,"(size_t)size","(size_t)0",(unsigned_long *)&local_38,
                   (unsigned_long *)&local_30);
        if (local_68.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_38);
          if (local_60 == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = (char *)*local_60;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,599,pcVar7);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if (local_38._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_38._M_head_impl + 8))();
          }
        }
        if (local_60 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_60 != local_60 + 2) {
            operator_delete((undefined8 *)*local_60);
          }
          operator_delete(local_60);
        }
        if (__s == (AssertHelperData *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14e3d0);
        }
        else {
          sVar6 = strlen((char *)__s);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)__s,sVar6);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
        metacall_allocator_free(uVar5,__s);
        metacall_allocator_destroy(uVar5);
        metacall_destroy();
        return;
      }
      testing::Message::Message(&local_68);
      if ((undefined8 *)CONCAT44(uStack_4c,uStack_50) == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)CONCAT44(uStack_4c,uStack_50);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                 ,0x6b,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,&local_68);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
  if (local_68.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_68.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  puVar1 = (undefined8 *)CONCAT44(uStack_4c,uStack_50);
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  return;
}

Assistant:

TEST_F(metacall_test, DefaultConstructor)
{
	metacall_print_info();

	metacall_log_stdio_type log_stdio = { stdout };

	ASSERT_EQ((int)0, (int)metacall_log(METACALL_LOG_STDIO, (void *)&log_stdio));

	ASSERT_EQ((int)0, (int)metacall_initialize());

/* Python */
#if defined(OPTION_BUILD_LOADERS_PY)
	{
	#if defined(WIN32) || defined(_WIN32)

		DWORD length = MAX_PATH;
		char cwd[MAX_PATH];

		ASSERT_NE((DWORD)0, (DWORD)GetCurrentDirectory(length, cwd));

	#elif defined(unix) || defined(__unix__) || defined(__unix) || \
		defined(linux) || defined(__linux__) || defined(__linux) || defined(__gnu_linux) || \
		defined(__CYGWIN__) || defined(__CYGWIN32__) || \
		defined(__MINGW32__) || defined(__MINGW64__) || \
		(defined(__APPLE__) && defined(__MACH__)) || defined(__MACOSX__)

		char cwd[PATH_MAX];

		ASSERT_NE((char *)NULL, (char *)getcwd(cwd, sizeof(cwd)));

	#endif

		/* Lazy evaluation of execution paths (do not initialize Python runtime) */
		ASSERT_EQ((int)0, (int)metacall_execution_path("py", cwd));
	}
#endif /* OPTION_BUILD_LOADERS_PY */

	/* Native register */
	{
		void *ret = NULL;

		void *func = NULL;

		int result = 0;

		ASSERT_EQ((int)0, (int)metacall_register("c_print", c_function, NULL, METACALL_INT, 1, METACALL_STRING));

		ret = metacall("c_print", "Hello native function!");

		EXPECT_NE((void *)NULL, (void *)ret);

		result = metacall_value_to_int(ret);

		EXPECT_EQ((int)result, (int)1);

		metacall_value_destroy(ret);

		func = metacall_function("c_print");

		EXPECT_NE((void *)NULL, (void *)func);

		ret = metacallf(func, "Hello native function!");

		EXPECT_NE((void *)NULL, (void *)ret);

		result = metacall_value_to_int(ret);

		EXPECT_EQ((int)result, (int)1);

		metacall_value_destroy(ret);
	}

/* Python */
#if defined(OPTION_BUILD_LOADERS_PY)
	{
		const char *py_scripts[] = {
			"example.py", "web.py"
		};

		const char web_content[] =
			"<html>\n"
			"  <head>\n"
			"    <title>MetaCall Python Web</title>\n"
			"  </head>\n"
			"  <body>\n"
			"    Hello World\n"
			"  </body>\n"
			"</html>\n";

		const long seven_multiples_limit = 10;

		long iterator;

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("py", py_scripts, sizeof(py_scripts) / sizeof(py_scripts[0]), NULL));

		/* Test for asyncness Python introspection */
		EXPECT_EQ((int)0, metacall_function_async(metacall_function("multiply")));

		ret = metacall("multiply", 5, 15);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)75);

		metacall_value_destroy(ret);

		for (iterator = 0; iterator <= seven_multiples_limit; ++iterator)
		{
			ret = metacall("multiply", 7, iterator);

			EXPECT_NE((void *)NULL, (void *)ret);

			EXPECT_EQ((long)metacall_value_to_long(ret), (long)(7 * iterator));

			metacall_value_destroy(ret);
		}

		ret = metacall("divide", 64.0, 2.0);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)32.0);

		metacall_value_destroy(ret);

		ret = metacall("sum", 1000, 3500);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)4500);

		metacall_value_destroy(ret);

		ret = metacall("sum", 3, 4);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)7);

		metacall_value_destroy(ret);

		ret = metacall("hello");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((enum metacall_value_id)METACALL_NULL, (enum metacall_value_id)metacall_value_id(ret));

		EXPECT_EQ((void *)NULL, (void *)metacall_value_to_null(ret));

		metacall_value_destroy(ret);

		ret = metacall("strcat", "Hello ", "Universe");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "Hello Universe"));

		metacall_value_destroy(ret);

		/* Testing Python Buffer */
		char buffer[] = { 0, 1, 2, 3, 4 };

		void *buffer_value = metacall_value_create_buffer((void *)buffer, sizeof(buffer));

		void *args[] = {
			buffer_value
		};

		EXPECT_NE((void *)NULL, (void *)buffer_value);

		ret = metacallv("bytebuff", args);

		metacall_value_destroy(buffer_value);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((size_t)sizeof("abcd") - 1, (size_t)metacall_value_size(ret));

		EXPECT_EQ((int)0, (int)memcmp(metacall_value_to_buffer(ret), "abcd", metacall_value_size(ret)));

		metacall_value_destroy(ret);

		const size_t dyn_buffer_size = 256;

		unsigned char *dyn_buffer = (unsigned char *)malloc(sizeof(unsigned char) * dyn_buffer_size);

		for (size_t i = 0; i < dyn_buffer_size; ++i)
		{
			dyn_buffer[i] = (unsigned char)i;
		}

		buffer_value = metacall_value_create_buffer((void *)dyn_buffer, dyn_buffer_size);

		EXPECT_NE((void *)NULL, (void *)buffer_value);

		args[0] = buffer_value;

		ret = metacallv("bytebuff", args);

		metacall_value_destroy(buffer_value);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((size_t)sizeof("abcd") - 1, (size_t)metacall_value_size(ret));

		EXPECT_EQ((int)0, (int)memcmp(metacall_value_to_buffer(ret), "abcd", metacall_value_size(ret)));

		metacall_value_destroy(ret);

		free(dyn_buffer);

		ret = metacall("index");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), web_content));

		metacall_value_destroy(ret);

	#if !defined(__MEMORYCHECK__) && !defined(__ADDRESS_SANITIZER__) && !defined(__THREAD_SANITIZER__) && !defined(__MEMORY_SANITIZER__)
		/* Testing corrupted value input */
		struct
		{
			int a;
			int corrupted;
			int value;
			char padding[100];
		} corrupted_value = { 0, 0, 0, { 0 } };

		void *corrupted_args[] = {
			(void *)&corrupted_value,
			(void *)&corrupted_value
		};

		EXPECT_EQ((void *)NULL, (void *)metacallfv_s(metacall_function("multiply"), corrupted_args, 2));

			/* Testing freed value input */

			/* TODO: The next snippet of code works but address sanitizer warns about access warning,
		* because in order to check the magic number we need to access the pointer to the struct.
		* A better solution would be, when using a custom memory pool allocator (aka object pool)
		* detect if the pointer is allocated or not in the object pool, so we track it without
		* need to access the pointer in order to read it. This can be a better improvement but
		* for now, this would be sufficient to catch most of the errors.
		*/

			/*
		void *freed_args[] = {
			(void *)metacall_value_create_long(3L),
			(void *)metacall_value_create_long(5L)
		};

		metacall_value_destroy(freed_args[0]);
		metacall_value_destroy(freed_args[1]);

		EXPECT_EQ((void *)NULL, (void *)metacallfv_s(metacall_function("multiply"), freed_args, 2));
		*/
	#endif
	}
#endif /* OPTION_BUILD_LOADERS_PY */

/* Ruby */
#if defined(OPTION_BUILD_LOADERS_RB)
	{
		const char *rb_scripts[] = {
			"hello.rb", "second.rb"
		};

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("rb", rb_scripts, sizeof(rb_scripts) / sizeof(rb_scripts[0]), NULL));

		ret = metacall("say_multiply", 5, 7);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)metacall_value_to_int(ret), (int)35);

		metacall_value_destroy(ret);

		ret = metacall("say_null");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((enum metacall_value_id)METACALL_NULL, (enum metacall_value_id)metacall_value_id(ret));

		metacall_value_destroy(ret);

		ret = metacall("say_hello", "meta-programmer");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "Hello meta-programmer!"));

		metacall_value_destroy(ret);

		ret = metacall("get_second", 5, 12);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)metacall_value_to_int(ret), (int)12);

		metacall_value_destroy(ret);

		const enum metacall_value_id backwards_prime_int_ids[] = {
			METACALL_INT, METACALL_INT
		};

		ret = metacallt("backwardsPrime", backwards_prime_int_ids, 9900, 10000);

		EXPECT_NE((void *)NULL, (void *)ret);

		void **v_array = metacall_value_to_array(ret);

		EXPECT_EQ((int)metacall_value_to_int(v_array[0]), (int)9923);
		EXPECT_EQ((int)metacall_value_to_int(v_array[1]), (int)9931);
		EXPECT_EQ((int)metacall_value_to_int(v_array[2]), (int)9941);
		EXPECT_EQ((int)metacall_value_to_int(v_array[3]), (int)9967);

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_RB */

/* JavaScript SpiderMonkey */
#if defined(OPTION_BUILD_LOADERS_JSM)
	{
		const char *jsm_scripts[] = {
			"spider.jsm"
		};

		EXPECT_EQ((int)0, (int)metacall_load_from_file("jsm", jsm_scripts, sizeof(jsm_scripts) / sizeof(jsm_scripts[0]), NULL));

		EXPECT_EQ((void *)NULL, (void *)metacall("say_spider", 8, 4));
	}
#endif /* OPTION_BUILD_LOADERS_JSM */

/* JavaScript V8 */
#if defined(OPTION_BUILD_LOADERS_JS) && !defined(OPTION_BUILD_LOADERS_NODE) /* TODO: NodeJS and V8 runtimes do not work at same time */
	{
		const char *js_scripts[] = {
			"divide.js", "third.js"
		};

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("js", js_scripts, sizeof(js_scripts) / sizeof(js_scripts[0]), NULL));

		ret = metacall("say_divide", 32.0, 4.0);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)8.0);

		metacall_value_destroy(ret);

		ret = metacall("some_text", "abc", "def");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "abcdef"));

		metacall_value_destroy(ret);

		ret = metacall("third_value", "abc", "def", "efg");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "efg"));

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_JS */

/* Mock */
#if defined(OPTION_BUILD_LOADERS_MOCK)
	{
		const char *mock_scripts[] = {
			"empty.mock"
		};

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("mock", mock_scripts, sizeof(mock_scripts) / sizeof(mock_scripts[0]), NULL));

		ret = metacall("my_empty_func");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)metacall_value_to_int(ret), (int)1234);

		metacall_value_destroy(ret);

		ret = metacall("two_doubles", 3.14, 68.3);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)3.1416);

		metacall_value_destroy(ret);

		ret = metacall("mixed_args", 'E', 16, 34L, 4.6, "hello");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((char)metacall_value_to_char(ret), (char)'A');

		metacall_value_destroy(ret);

		ret = metacall("new_args", "goodbye");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "Hello World"));

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_MOCK */

/* C# NetCore */
#if defined(OPTION_BUILD_LOADERS_CS)
	{
		const char *cs_scripts[] = {
			"hello.cs"
		};

		EXPECT_EQ((int)0, (int)metacall_load_from_file("cs", cs_scripts, sizeof(cs_scripts) / sizeof(cs_scripts[0]), NULL));

		EXPECT_EQ((void *)NULL, (void *)metacall("Say", "Hello para with params!"));
	}
#endif /* OPTION_BUILD_LOADERS_CS */

/* C */
#if defined(OPTION_BUILD_LOADERS_C)
	{
		const char *c_scripts[] = {
			"compiled.c"
		};

		EXPECT_EQ((int)0, (int)metacall_load_from_file("c", c_scripts, sizeof(c_scripts) / sizeof(c_scripts[0]), NULL));
	}
#endif /* OPTION_BUILD_LOADERS_C */

/* NodeJS */
#if defined(OPTION_BUILD_LOADERS_NODE)
	{
		const char *node_scripts[] = {
			"nod.js"
		};

		const enum metacall_value_id hello_boy_double_ids[] = {
			METACALL_DOUBLE, METACALL_DOUBLE
		};

		const char buffer[] =
			"function nodmem() {\n"
			"\treturn 43;\n"
			"\t}\n"
			"module.exports = { nodmem };\n";

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("node", node_scripts, sizeof(node_scripts) / sizeof(node_scripts[0]), NULL));

		ret = metacallt("hello_boy", hello_boy_double_ids, 3.0, 4.0);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)7.0);

		metacall_value_destroy(ret);

		ret = metacall("lambda");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)15.0);

		metacall_value_destroy(ret);

		/* TODO: Implement all remaining calls for nod.js */

		ASSERT_EQ((int)0, (int)metacall_load_from_memory("node", buffer, sizeof(buffer), NULL));

		ret = metacall("nodmem");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)43.0);

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_NODE */

/* File */
#if defined(OPTION_BUILD_LOADERS_FILE)
	{
		const char *file_scripts[] = {
			"static.html",
			"favicon.ico"
		};

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("file", file_scripts, sizeof(file_scripts) / sizeof(file_scripts[0]), NULL));

		ret = metacall("static.html");

		EXPECT_NE((void *)NULL, (void *)ret);

		std::cout << metacall_value_to_string(ret) << std::endl;

		metacall_value_destroy(ret);

		ret = metacall("favicon.ico");

		EXPECT_NE((void *)NULL, (void *)ret);

		std::cout << metacall_value_to_string(ret) << std::endl;

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_FILE */

	/* Print inspect information */
	{
		size_t size = 0;

		struct metacall_allocator_std_type std_ctx = { &std::malloc, &std::realloc, &std::free };

		void *allocator = metacall_allocator_create(METACALL_ALLOCATOR_STD, (void *)&std_ctx);

		char *inspect_str = metacall_inspect(&size, allocator);

		EXPECT_NE((char *)NULL, (char *)inspect_str);

		EXPECT_GT((size_t)size, (size_t)0);

		std::cout << inspect_str << std::endl;

		metacall_allocator_free(allocator, inspect_str);

		metacall_allocator_destroy(allocator);
	}

	metacall_destroy();
}